

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O3

string * MovementToStr_abi_cxx11_(string *__return_storage_ptr__,Movement move)

{
  uint pos;
  uint pos_00;
  string local_48;
  
  pos_00 = move._0_4_ & 0xff;
  pos = move._1_4_ & 0xff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (pos_00 == pos) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"   0","");
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    IntToStr_abi_cxx11_(&local_48,pos_00);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    IntToStr_abi_cxx11_(&local_48,pos);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MovementToStr (const Movement move ) {
	if (move.from == move.to) {
		return "   0";
	}
	std::string s = "";
	s += IntToStr (move.from);
	s += IntToStr (move.to);
	return s;
}